

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_alignment_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  BaseType BVar1;
  bool bVar2;
  CompilerError *pCVar3;
  ulong uVar4;
  size_t sVar5;
  uint *puVar6;
  uint32_t local_8c;
  uint32_t local_84;
  uint32_t local_40;
  uint32_t vecsize;
  uint local_38;
  uint32_t i;
  uint32_t alignment;
  byte local_22;
  byte local_21;
  bool row_major_local;
  SPIRType *pSStack_20;
  bool is_packed_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  if (((type->pointer & 1U) == 0) || (type->storage != PhysicalStorageBuffer)) {
    BVar1 = type->basetype;
    local_22 = row_major;
    local_21 = is_packed;
    pSStack_20 = type;
    type_local = (SPIRType *)this;
    if ((BVar1 < Boolean) || (BVar1 == AtomicCounter)) {
LAB_00397674:
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"Querying alignment of opaque object.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (BVar1 == Double) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"double types are not supported in buffers in MSL.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (BVar1 == Struct) {
      local_38 = 1;
      for (vecsize = 0; uVar4 = (ulong)vecsize,
          sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(pSStack_20->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
          uVar4 < sVar5; vecsize = vecsize + 1) {
        local_40 = get_declared_struct_member_alignment_msl(this,pSStack_20,vecsize);
        puVar6 = ::std::max<unsigned_int>(&local_38,&local_40);
        local_38 = *puVar6;
      }
      this_local._4_4_ = local_38;
    }
    else {
      if (BVar1 - Image < 3) goto LAB_00397674;
      if ((type->basetype == Int64) &&
         (bVar2 = Options::supports_msl_version(&this->msl_options,2,3,0), !bVar2)) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar3,"long types in buffers are only supported in MSL 2.3 and above.");
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((pSStack_20->basetype == UInt64) &&
         (bVar2 = Options::supports_msl_version(&this->msl_options,2,3,0), !bVar2)) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar3,"ulong types in buffers are only supported in MSL 2.3 and above.");
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((local_21 & 1) == 0) {
        if (((local_22 & 1) == 0) || (pSStack_20->columns < 2)) {
          local_84 = pSStack_20->vecsize;
        }
        else {
          local_84 = pSStack_20->columns;
        }
        if (local_84 == 3) {
          local_8c = 4;
        }
        else {
          local_8c = local_84;
        }
        this_local._4_4_ = (pSStack_20->width >> 3) * local_8c;
      }
      else {
        this_local._4_4_ = pSStack_20->width >> 3;
      }
    }
  }
  else {
    this_local._4_4_ = 8;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_declared_type_alignment_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	// Pointers align on multiples of 8 bytes.
	// Deliberately ignore array-ness here. It's not relevant for alignment.
	if (type.pointer && type.storage == StorageClassPhysicalStorageBuffer)
		return 8;

	switch (type.basetype)
	{
	case SPIRType::Unknown:
	case SPIRType::Void:
	case SPIRType::AtomicCounter:
	case SPIRType::Image:
	case SPIRType::SampledImage:
	case SPIRType::Sampler:
		SPIRV_CROSS_THROW("Querying alignment of opaque object.");

	case SPIRType::Double:
		SPIRV_CROSS_THROW("double types are not supported in buffers in MSL.");

	case SPIRType::Struct:
	{
		// In MSL, a struct's alignment is equal to the maximum alignment of any of its members.
		uint32_t alignment = 1;
		for (uint32_t i = 0; i < type.member_types.size(); i++)
			alignment = max(alignment, uint32_t(get_declared_struct_member_alignment_msl(type, i)));
		return alignment;
	}

	default:
	{
		if (type.basetype == SPIRType::Int64 && !msl_options.supports_msl_version(2, 3))
			SPIRV_CROSS_THROW("long types in buffers are only supported in MSL 2.3 and above.");
		if (type.basetype == SPIRType::UInt64 && !msl_options.supports_msl_version(2, 3))
			SPIRV_CROSS_THROW("ulong types in buffers are only supported in MSL 2.3 and above.");
		// Alignment of packed type is the same as the underlying component or column size.
		// Alignment of unpacked type is the same as the vector size.
		// Alignment of 3-elements vector is the same as 4-elements (including packed using column).
		if (is_packed)
		{
			// If we have packed_T and friends, the alignment is always scalar.
			return type.width / 8;
		}
		else
		{
			// This is the general rule for MSL. Size == alignment.
			uint32_t vecsize = (row_major && type.columns > 1) ? type.columns : type.vecsize;
			return (type.width / 8) * (vecsize == 3 ? 4 : vecsize);
		}
	}
	}
}